

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O1

FixedFieldInfo * __thiscall IR::Instr::GetFixedFunction(Instr *this)

{
  Opnd *this_00;
  code *pcVar1;
  bool bVar2;
  OpndKind OVar3;
  undefined4 *puVar4;
  
  bVar2 = HasFixedFunctionAddressTarget(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
                       ,0xe03,"(HasFixedFunctionAddressTarget())","HasFixedFunctionAddressTarget()")
    ;
    if (!bVar2) goto LAB_004c2564;
    *puVar4 = 0;
  }
  this_00 = this->m_src1;
  OVar3 = Opnd::GetKind(this_00);
  if (OVar3 != OpndKindAddr) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
    if (!bVar2) {
LAB_004c2564:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return (FixedFieldInfo *)this_00[1]._vptr_Opnd;
}

Assistant:

FixedFieldInfo* Instr::GetFixedFunction() const
{
    Assert(HasFixedFunctionAddressTarget());
    FixedFieldInfo* function = (FixedFieldInfo*)this->m_src1->AsAddrOpnd()->m_metadata;
    return function;
}